

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DACSThinker::Tick(DACSThinker *this)

{
  DLevelScript *pDVar1;
  uint uVar2;
  int size;
  DLevelScript *next;
  DLevelScript *script;
  DACSThinker *this_local;
  
  next = this->Scripts;
  while (next != (DLevelScript *)0x0) {
    pDVar1 = next->next;
    DLevelScript::RunScript(next);
    next = pDVar1;
  }
  uVar2 = TArray<FString,_FString>::Size(&ACS_StringBuilderStack);
  if (uVar2 != 0) {
    uVar2 = TArray<FString,_FString>::Size(&ACS_StringBuilderStack);
    TArray<FString,_FString>::Clear(&ACS_StringBuilderStack);
    I_Error("Error: %d garbage entries on ACS string builder stack.",(ulong)uVar2);
  }
  return;
}

Assistant:

void DACSThinker::Tick ()
{
	DLevelScript *script = Scripts;

	while (script)
	{
		DLevelScript *next = script->next;
		script->RunScript ();
		script = next;
	}

//	GlobalACSStrings.Clear();

	if (ACS_StringBuilderStack.Size())
	{
		int size = ACS_StringBuilderStack.Size();
		ACS_StringBuilderStack.Clear();
		I_Error("Error: %d garbage entries on ACS string builder stack.", size);
	}
}